

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_integral.cpp
# Opt level: O2

void duckdb::IntegralDecompressFunction<unsigned_long,duckdb::hugeint_t>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  VectorType VVar1;
  idx_t count;
  hugeint_t *phVar2;
  idx_t *piVar3;
  unsigned_long *puVar4;
  data_ptr_t pdVar5;
  optional_idx oVar6;
  reference pvVar7;
  Vector *vector;
  idx_t iVar8;
  SelectionVector *sel;
  int64_t *piVar9;
  idx_t iVar10;
  hugeint_t hVar11;
  undefined1 in_stack_ffffffffffffff58;
  hugeint_t *local_a0;
  hugeint_t min_val;
  optional_idx dict_size;
  unsigned_long *local_68;
  
  pvVar7 = vector<duckdb::Vector,_true>::get<true>(&args->data,1);
  min_val.lower = *(uint64_t *)pvVar7->data;
  min_val.upper = *(uint64_t *)((long)pvVar7->data + 8);
  pvVar7 = vector<duckdb::Vector,_true>::get<true>(&args->data,0);
  count = args->count;
  VVar1 = pvVar7->vector_type;
  local_a0 = &min_val;
  if (VVar1 == FLAT_VECTOR) {
    Vector::SetVectorType(result,FLAT_VECTOR);
    phVar2 = (hugeint_t *)result->data;
    puVar4 = (unsigned_long *)pvVar7->data;
    FlatVector::VerifyFlatVector(pvVar7);
    FlatVector::VerifyFlatVector(result);
    UnaryExecutor::
    ExecuteFlat<unsigned_long,duckdb::hugeint_t,duckdb::UnaryLambdaWrapper,duckdb::IntegralDecompressFunction<unsigned_long,duckdb::hugeint_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(unsigned_long_const&)_1_>
              (puVar4,phVar2,count,&pvVar7->validity,&result->validity,&local_a0,
               (bool)in_stack_ffffffffffffff58);
  }
  else {
    if (VVar1 == DICTIONARY_VECTOR) {
      dict_size = DictionaryVector::DictionarySize(pvVar7);
      if (((dict_size.index != 0xffffffffffffffff) &&
          (iVar10 = optional_idx::GetIndex(&dict_size), iVar10 * 2 <= count)) &&
         (vector = DictionaryVector::Child(pvVar7), vector->vector_type == FLAT_VECTOR)) {
        phVar2 = (hugeint_t *)result->data;
        puVar4 = (unsigned_long *)vector->data;
        iVar10 = optional_idx::GetIndex(&dict_size);
        FlatVector::VerifyFlatVector(vector);
        FlatVector::VerifyFlatVector(result);
        UnaryExecutor::
        ExecuteFlat<unsigned_long,duckdb::hugeint_t,duckdb::UnaryLambdaWrapper,duckdb::IntegralDecompressFunction<unsigned_long,duckdb::hugeint_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(unsigned_long_const&)_1_>
                  (puVar4,phVar2,iVar10,&vector->validity,&result->validity,&local_a0,
                   (bool)in_stack_ffffffffffffff58);
        sel = DictionaryVector::SelVector(pvVar7);
        iVar10 = optional_idx::GetIndex(&dict_size);
        Vector::Dictionary(result,result,iVar10,sel,count);
        return;
      }
    }
    else if (VVar1 == CONSTANT_VECTOR) {
      Vector::SetVectorType(result,CONSTANT_VECTOR);
      phVar2 = (hugeint_t *)result->data;
      piVar3 = (idx_t *)pvVar7->data;
      puVar4 = (pvVar7->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar4 != (unsigned_long *)0x0) && ((*puVar4 & 1) == 0)) {
        ConstantVector::SetNull(result,true);
        return;
      }
      ConstantVector::SetNull(result,false);
      dict_size.index = *piVar3;
      hVar11 = TemplatedIntegralDecompress<unsigned_long,_duckdb::hugeint_t>::Operation
                         (&dict_size.index,&min_val);
      *phVar2 = hVar11;
      return;
    }
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&dict_size);
    Vector::ToUnifiedFormat(pvVar7,count,(UnifiedVectorFormat *)&dict_size);
    Vector::SetVectorType(result,FLAT_VECTOR);
    oVar6 = dict_size;
    pdVar5 = result->data;
    FlatVector::VerifyFlatVector(result);
    if (local_68 == (unsigned_long *)0x0) {
      piVar9 = (int64_t *)(pdVar5 + 8);
      for (iVar10 = 0; count != iVar10; iVar10 = iVar10 + 1) {
        hVar11 = TemplatedIntegralDecompress<unsigned_long,_duckdb::hugeint_t>::Operation
                           ((unsigned_long *)&stack0xffffffffffffff58,&min_val);
        piVar9[-1] = hVar11.lower;
        *piVar9 = hVar11.upper;
        piVar9 = piVar9 + 2;
      }
    }
    else {
      piVar9 = (int64_t *)(pdVar5 + 8);
      for (iVar10 = 0; count != iVar10; iVar10 = iVar10 + 1) {
        iVar8 = iVar10;
        if (*(long *)oVar6.index != 0) {
          iVar8 = (idx_t)*(uint *)(*(long *)oVar6.index + iVar10 * 4);
        }
        if ((local_68[iVar8 >> 6] >> (iVar8 & 0x3f) & 1) == 0) {
          TemplatedValidityMask<unsigned_long>::SetInvalid
                    (&(result->validity).super_TemplatedValidityMask<unsigned_long>,iVar10);
        }
        else {
          hVar11 = TemplatedIntegralDecompress<unsigned_long,_duckdb::hugeint_t>::Operation
                             ((unsigned_long *)&stack0xffffffffffffff58,&min_val);
          piVar9[-1] = hVar11.lower;
          *piVar9 = hVar11.upper;
        }
        piVar9 = piVar9 + 2;
      }
    }
    UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)&dict_size);
  }
  return;
}

Assistant:

static void IntegralDecompressFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(args.ColumnCount() == 2);
	D_ASSERT(args.data[1].GetVectorType() == VectorType::CONSTANT_VECTOR);
	D_ASSERT(args.data[1].GetType() == result.GetType());
	const auto min_val = ConstantVector::GetData<RESULT_TYPE>(args.data[1])[0];
	UnaryExecutor::Execute<INPUT_TYPE, RESULT_TYPE>(
	    args.data[0], result, args.size(),
	    [&](const INPUT_TYPE &input) {
		    return TemplatedIntegralDecompress<INPUT_TYPE, RESULT_TYPE>::Operation(input, min_val);
	    },
	    FunctionErrors::CANNOT_ERROR);
}